

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_bool32
drwav_preinit(drwav *pWav,drwav_read_proc onRead,drwav_seek_proc onSeek,void *pReadSeekUserData,
             drwav_allocation_callbacks *pAllocationCallbacks)

{
  _func_void_ptr_size_t_void_ptr *p_Var1;
  _func_void_ptr_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  drwav_bool32 dVar4;
  
  dVar4 = 0;
  if (onSeek != (drwav_seek_proc)0x0 && (onRead != (drwav_read_proc)0x0 && pWav != (drwav *)0x0)) {
    memset(&pWav->onWrite,0,0x1b0);
    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->pUserData = pReadSeekUserData;
    if (pAllocationCallbacks == (drwav_allocation_callbacks *)0x0) {
      (pWav->allocationCallbacks).onMalloc = drwav__malloc_default;
      (pWav->allocationCallbacks).onRealloc = drwav__realloc_default;
      (pWav->allocationCallbacks).onFree = drwav__free_default;
    }
    else {
      p_Var1 = pAllocationCallbacks->onMalloc;
      p_Var2 = pAllocationCallbacks->onRealloc;
      p_Var3 = pAllocationCallbacks->onFree;
      (pWav->allocationCallbacks).pUserData = pAllocationCallbacks->pUserData;
      (pWav->allocationCallbacks).onMalloc = p_Var1;
      (pWav->allocationCallbacks).onRealloc = p_Var2;
      (pWav->allocationCallbacks).onFree = p_Var3;
      if (p_Var3 == (_func_void_void_ptr_void_ptr *)0x0) {
        return 0;
      }
      if (p_Var1 == (_func_void_ptr_size_t_void_ptr *)0x0 &&
          p_Var2 == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
        return 0;
      }
    }
    dVar4 = 1;
  }
  return dVar4;
}

Assistant:

static drwav_bool32 drwav_preinit(drwav* pWav, drwav_read_proc onRead, drwav_seek_proc onSeek, void* pReadSeekUserData, const drwav_allocation_callbacks* pAllocationCallbacks)
{
    if (pWav == NULL || onRead == NULL || onSeek == NULL) {
        return DRWAV_FALSE;
    }

    DRWAV_ZERO_MEMORY(pWav, sizeof(*pWav));
    pWav->onRead    = onRead;
    pWav->onSeek    = onSeek;
    pWav->pUserData = pReadSeekUserData;
    pWav->allocationCallbacks = drwav_copy_allocation_callbacks_or_defaults(pAllocationCallbacks);

    if (pWav->allocationCallbacks.onFree == NULL || (pWav->allocationCallbacks.onMalloc == NULL && pWav->allocationCallbacks.onRealloc == NULL)) {
        return DRWAV_FALSE;    /* Invalid allocation callbacks. */
    }

    return DRWAV_TRUE;
}